

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_vcf_by_region.cc
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  htsFile *hfp;
  bcf_hdr_t *pbVar2;
  bcf_srs_t *readers;
  ostream *poVar3;
  runtime_error *this;
  bcf1_t *pbVar4;
  
  if (argc != 3) {
    usage();
    return 1;
  }
  hfp = hts_open(argv[1],"r");
  if (hfp == (htsFile *)0x0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Unable to open file.");
  }
  else {
    pbVar2 = bcf_hdr_read(hfp);
    if (pbVar2 != (bcf_hdr_t *)0x0) {
      readers = bcf_sr_init();
      bcf_sr_set_regions(readers,argv[2],0);
      bcf_sr_add_reader(readers,argv[1]);
      poVar3 = std::operator<<((ostream *)&std::cout,"chromosome\tposition\tnum_alleles");
      std::endl<char,std::char_traits<char>>(poVar3);
      while (iVar1 = bcf_sr_next_line(readers), iVar1 != 0) {
        if (*readers->has_line == 0) {
          pbVar4 = (bcf1_t *)0x0;
        }
        else {
          pbVar4 = *readers->readers->buffer;
        }
        poVar3 = std::operator<<((ostream *)&std::cout,pbVar2->id[1][pbVar4->rid].key);
        poVar3 = std::operator<<(poVar3,"\t");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        poVar3 = std::operator<<(poVar3,"\t");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      bcf_sr_destroy(readers);
      return 0;
    }
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Unable to read header.");
  }
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main(int argc, char* argv[]) {
    if(argc == 3) {
        //init
        htsFile *test_bcf = NULL;
        bcf_hdr_t *test_header = NULL;
        test_bcf = bcf_open(argv[1], "r");
        if(test_bcf == NULL) {
            throw std::runtime_error("Unable to open file.");
        }
        test_header = bcf_hdr_read(test_bcf);
        if(test_header == NULL) {
            throw std::runtime_error("Unable to read header.");
        }

        bcf_srs_t *sr = bcf_sr_init();
        bcf_sr_set_regions(sr, argv[2], 0);
        bcf_sr_add_reader(sr, argv[1]);
        std::cout << "chromosome\tposition\tnum_alleles" << std::endl;
        while (bcf_sr_next_line(sr)) {
            bcf1_t *line = bcf_sr_get_line(sr, 0);
            cout << bcf_hdr_id2name(test_header, line->rid) \
                 << "\t" << line->pos \
                 << "\t" << line->n_allele << endl;
        }
        bcf_sr_destroy(sr);
    } else {
        return usage();
    }
    return 0;
}